

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>::
reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source)

{
  char cVar1;
  
  basic_msgpack_parser<jsoncons::bytes_source,std::allocator<char>>::
  reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(this + 8),
             source);
  basic_staj_visitor<char>::reset((basic_staj_visitor<char> *)(this + 0xa0));
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x100)
            );
  this[0x1d0] = (basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>)0x0;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 != '\0') {
    return;
  }
  (**(code **)(*(long *)this + 0x38))(this);
  return;
}

Assistant:

void reset(Sourceable&& source)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }